

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
::operator()(gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
             *this,float *blockB,blas_data_mapper<float,_long,_0,_0,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  float *pfVar1;
  float (*pafVar2) [4];
  float *pfVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  Packet4f afVar4;
  long local_330;
  long k_1;
  LinearMapper dm0_1;
  long j2_1;
  PacketBlock<__attribute__((__vector_size__(4_*_sizeof(float))))_float,_4> kernel;
  long local_2d0;
  long k;
  LinearMapper dm3;
  LinearMapper dm2;
  LinearMapper dm1;
  LinearMapper dm0;
  long j2;
  long peeled_k;
  long count;
  long packet_cols4;
  long packet_cols8;
  long lStack_278;
  conj_if<false> cj;
  long stride_local;
  long cols_local;
  long depth_local;
  blas_data_mapper<float,_long,_0,_0,_1> *rhs_local;
  float *blockB_local;
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  *this_local;
  undefined1 local_230 [8];
  long local_228;
  undefined8 local_220;
  blas_data_mapper<float,_long,_0,_0,_1> *local_218;
  undefined1 local_210 [8];
  long local_208;
  undefined8 local_200;
  blas_data_mapper<float,_long,_0,_0,_1> *local_1f8;
  undefined1 local_1f0 [8];
  long local_1e8;
  undefined8 local_1e0;
  blas_data_mapper<float,_long,_0,_0,_1> *local_1d8;
  undefined1 local_1d0 [8];
  float *local_1c8;
  undefined8 local_1c0;
  blas_data_mapper<float,_long,_0,_0,_1> *local_1b8;
  undefined1 local_1b0 [8];
  long local_1a8;
  long *local_1a0;
  float *local_198;
  long local_190;
  LinearMapper *local_188;
  float *local_180;
  long local_178;
  LinearMapper *local_170;
  float *local_168;
  long local_160;
  LinearMapper *local_158;
  float *local_150;
  float *local_148;
  undefined8 local_140;
  blas_data_mapper<float,_long,_0,_0,_1> *local_138;
  long local_130;
  undefined8 local_128;
  blas_data_mapper<float,_long,_0,_0,_1> *local_120;
  long local_118;
  undefined8 local_110;
  blas_data_mapper<float,_long,_0,_0,_1> *local_108;
  long local_100;
  undefined8 local_f8;
  blas_data_mapper<float,_long,_0,_0,_1> *local_f0;
  float *local_e8;
  undefined8 local_e0;
  blas_data_mapper<float,_long,_0,_0,_1> *local_d8;
  undefined8 local_d0;
  float *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  float *local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  float *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  float *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  float *local_68;
  undefined1 *local_60;
  long local_58;
  long *local_50;
  long local_48;
  long *local_40;
  long local_38;
  LinearMapper *local_30;
  long local_28;
  LinearMapper *local_20;
  long local_18;
  LinearMapper *local_10;
  
  lStack_278 = stride;
  ignore_unused_variable<long>(&stack0xfffffffffffffd88);
  ignore_unused_variable<long>(&offset);
  if (depth <= lStack_278 && offset <= lStack_278) {
    pfVar1 = (float *)(cols / 4 << 2);
    peeled_k = 0;
    for (dm0.m_data = (float *)0x0; dm0_1.m_data = pfVar1, (long)dm0.m_data < (long)pfVar1;
        dm0.m_data = dm0.m_data + 1) {
      peeled_k = offset * 4 + peeled_k;
      local_1c0 = 0;
      local_1c8 = dm0.m_data;
      local_140 = 0;
      local_148 = dm0.m_data;
      dm1.m_data = rhs->m_data + (long)dm0.m_data * rhs->m_stride;
      local_c0 = local_1b0;
      local_d0 = 1;
      local_1e8 = (long)dm0.m_data + 1;
      local_1e0 = 0;
      local_128 = 0;
      dm2.m_data = rhs->m_data + local_1e8 * rhs->m_stride;
      local_a8 = local_1d0;
      local_b8 = 1;
      local_208 = (long)dm0.m_data + 2;
      local_200 = 0;
      local_110 = 0;
      dm3.m_data = rhs->m_data + local_208 * rhs->m_stride;
      local_90 = local_1f0;
      local_a0 = 1;
      local_228 = (long)dm0.m_data + 3;
      local_220 = 0;
      local_f8 = 0;
      k = (long)(rhs->m_data + local_228 * rhs->m_stride);
      local_78 = local_210;
      local_88 = 1;
      local_218 = rhs;
      local_1f8 = rhs;
      local_1d8 = rhs;
      local_1b8 = rhs;
      local_138 = rhs;
      local_130 = local_1e8;
      local_120 = rhs;
      local_118 = local_208;
      local_108 = rhs;
      local_100 = local_228;
      local_f0 = rhs;
      local_c8 = dm1.m_data;
      local_b0 = dm2.m_data;
      local_98 = dm3.m_data;
      local_80 = (float *)k;
      for (local_2d0 = 0; local_2d0 < depth / 4 << 2; local_2d0 = local_2d0 + 4) {
        local_158 = &dm1;
        local_160 = local_2d0;
        local_150 = dm1.m_data + local_2d0;
        afVar4 = ploadu<float__vector(4)>(local_150);
        unique0x100000f2 = (float)extraout_XMM0_Dc;
        j2_1._0_4_ = (float)(int)afVar4._0_8_;
        j2_1._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
        unique0x100000f6 = extraout_XMM0_Dd;
        local_170 = &dm2;
        local_178 = local_2d0;
        local_168 = dm2.m_data + local_2d0;
        afVar4 = ploadu<float__vector(4)>(local_168);
        kernel.packet[1][0] = extraout_XMM0_Dc_00;
        kernel.packet[0]._8_8_ = afVar4._0_8_;
        kernel.packet[1][1] = extraout_XMM0_Dd_00;
        local_188 = &dm3;
        local_190 = local_2d0;
        local_180 = dm3.m_data + local_2d0;
        afVar4 = ploadu<float__vector(4)>(local_180);
        kernel.packet[2][0] = extraout_XMM0_Dc_01;
        kernel.packet[1]._8_8_ = afVar4._0_8_;
        kernel.packet[2][1] = extraout_XMM0_Dd_01;
        local_1a0 = &k;
        local_1a8 = local_2d0;
        local_198 = (float *)(k + local_2d0 * 4);
        afVar4 = ploadu<float__vector(4)>(local_198);
        kernel.packet[3][0] = extraout_XMM0_Dc_02;
        kernel.packet[2]._8_8_ = afVar4._0_8_;
        kernel.packet[3][1] = extraout_XMM0_Dd_02;
        ptranspose((PacketBlock<__attribute__((__vector_size__(4_*_sizeof(float))))_float,_4> *)
                   &j2_1);
        pafVar2 = conj_if<false>::pconj<float__vector(4)>
                            ((conj_if<false> *)((long)&packet_cols8 + 7),(float (*) [4])&j2_1);
        pstoreu<float,float__vector(4)>(blockB + peeled_k,pafVar2);
        pafVar2 = conj_if<false>::pconj<float__vector(4)>
                            ((conj_if<false> *)((long)&packet_cols8 + 7),
                             (float (*) [4])(kernel.packet[0] + 2));
        pstoreu<float,float__vector(4)>(blockB + peeled_k + 4,pafVar2);
        pafVar2 = conj_if<false>::pconj<float__vector(4)>
                            ((conj_if<false> *)((long)&packet_cols8 + 7),
                             (float (*) [4])(kernel.packet[1] + 2));
        pstoreu<float,float__vector(4)>(blockB + peeled_k + 8,pafVar2);
        pafVar2 = conj_if<false>::pconj<float__vector(4)>
                            ((conj_if<false> *)((long)&packet_cols8 + 7),
                             (float (*) [4])(kernel.packet[2] + 2));
        pstoreu<float,float__vector(4)>(blockB + peeled_k + 0xc,pafVar2);
        peeled_k = peeled_k + 0x10;
      }
      for (; local_2d0 < depth; local_2d0 = local_2d0 + 1) {
        local_10 = &dm1;
        local_18 = local_2d0;
        pfVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm1.m_data + local_2d0);
        blockB[peeled_k] = *pfVar3;
        local_20 = &dm2;
        local_28 = local_2d0;
        pfVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm2.m_data + local_2d0);
        blockB[peeled_k + 1] = *pfVar3;
        local_30 = &dm3;
        local_38 = local_2d0;
        pfVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm3.m_data + local_2d0);
        blockB[peeled_k + 2] = *pfVar3;
        local_40 = &k;
        local_48 = local_2d0;
        pfVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),(float *)(k + local_2d0 * 4)
                           );
        blockB[peeled_k + 3] = *pfVar3;
        peeled_k = peeled_k + 4;
      }
      peeled_k = ((lStack_278 - offset) - depth) * 4 + peeled_k;
    }
    for (; (long)dm0_1.m_data < cols; dm0_1.m_data = dm0_1.m_data + 1) {
      peeled_k = offset + peeled_k;
      local_e0 = 0;
      local_e8 = dm0_1.m_data;
      k_1 = (long)(rhs->m_data + (long)dm0_1.m_data * rhs->m_stride);
      local_60 = local_230;
      local_70 = 1;
      local_d8 = rhs;
      local_68 = (float *)k_1;
      for (local_330 = 0; local_330 < depth; local_330 = local_330 + 1) {
        local_50 = &k_1;
        local_58 = local_330;
        pfVar1 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),
                            (float *)(k_1 + local_330 * 4));
        blockB[peeled_k] = *pfVar1;
        peeled_k = peeled_k + 1;
      }
      peeled_k = ((lStack_278 - offset) - depth) + peeled_k;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x958,
                "void Eigen::internal::gemm_pack_rhs<float, long, Eigen::internal::blas_data_mapper<float, long, 0>, 4, 0, false, true>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = float, Index = long, DataMapper = Eigen::internal::blas_data_mapper<float, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enable vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0           ] = dm0.template loadPacket<Packet>(k);
          kernel.packet[1%PacketSize] = dm1.template loadPacket<Packet>(k);
          kernel.packet[2%PacketSize] = dm2.template loadPacket<Packet>(k);
          kernel.packet[3%PacketSize] = dm3.template loadPacket<Packet>(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}